

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

bool __thiscall Builder::FinishCommand(Builder *this,Result *result,string *err)

{
  Status *pSVar1;
  DiskInterface *pDVar2;
  Metrics *this_00;
  iterator iVar3;
  pointer ppNVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  pointer ppVar9;
  int64_t iVar10;
  Node **ppNVar11;
  Node **ppNVar12;
  reference ppNVar13;
  BuildLog *pBVar14;
  int *piVar15;
  char *pcVar16;
  reference ppNVar17;
  string *psVar18;
  DepsLog *this_01;
  Metric *local_308;
  allocator<char> local_2d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  long local_298;
  TimeStamp deps_mtime;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_288;
  __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_280;
  const_iterator o_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  undefined1 local_230 [8];
  string rspfile;
  TimeStamp depfile_mtime;
  string depfile;
  TimeStamp input_mtime;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_1d8;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_1d0;
  iterator i;
  TimeStamp restat_mtime;
  TimeStamp new_mtime;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_1b0;
  iterator o;
  undefined1 local_1a0 [6];
  bool node_cleaned;
  byte local_179;
  Node **ppNStack_178;
  bool restat;
  TimeStamp output_mtime;
  _Base_ptr local_168;
  _Base_ptr local_160;
  _Rb_tree_iterator<std::pair<const_Edge_*const,_int>_> local_158;
  iterator it;
  int64_t end_time_millis;
  int64_t start_time_millis;
  string extract_err;
  string local_118;
  undefined1 local_f8 [8];
  string deps_prefix;
  string local_d0;
  undefined1 local_b0 [8];
  string deps_type;
  vector<Node_*,_std::allocator<Node_*>_> deps_nodes;
  Edge *edge;
  ScopedMetric metrics_h_scoped;
  bool local_4a;
  allocator<char> local_49;
  string local_48;
  string *local_28;
  string *err_local;
  Result *result_local;
  Builder *this_local;
  
  local_28 = err;
  err_local = (string *)result;
  result_local = (Result *)this;
  if ((FinishCommand(CommandRunner::Result*,std::__cxx11::string*)::metrics_h_metric == '\0') &&
     (iVar6 = __cxa_guard_acquire(&FinishCommand(CommandRunner::Result*,std::__cxx11::string*)::
                                   metrics_h_metric), this_00 = g_metrics, iVar6 != 0)) {
    metrics_h_scoped.start_._3_1_ = 0;
    local_4a = g_metrics == (Metrics *)0x0;
    if (local_4a) {
      local_308 = (Metric *)0x0;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"FinishCommand",&local_49);
      metrics_h_scoped.start_._3_1_ = 1;
      local_308 = Metrics::NewMetric(this_00,&local_48);
    }
    local_4a = !local_4a;
    if ((metrics_h_scoped.start_._3_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_48);
    }
    if (local_4a) {
      std::allocator<char>::~allocator(&local_49);
    }
    FinishCommand::metrics_h_metric = local_308;
    __cxa_guard_release(&FinishCommand(CommandRunner::Result*,std::__cxx11::string*)::
                         metrics_h_metric);
  }
  ScopedMetric::ScopedMetric((ScopedMetric *)&edge,FinishCommand::metrics_h_metric);
  deps_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = *(pointer *)err_local;
  std::vector<Node_*,_std::allocator<Node_*>_>::vector
            ((vector<Node_*,_std::allocator<Node_*>_> *)((long)&deps_type.field_2 + 8));
  ppNVar4 = deps_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"deps",(allocator<char> *)(deps_prefix.field_2._M_local_buf + 0xf))
  ;
  Edge::GetBinding((string *)local_b0,(Edge *)ppNVar4,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)(deps_prefix.field_2._M_local_buf + 0xf));
  ppNVar4 = deps_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"msvc_deps_prefix",
             (allocator<char> *)(extract_err.field_2._M_local_buf + 0xf));
  Edge::GetBinding((string *)local_f8,(Edge *)ppNVar4,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)(extract_err.field_2._M_local_buf + 0xf));
  uVar8 = std::__cxx11::string::empty();
  if ((uVar8 & 1) == 0) {
    std::__cxx11::string::string((string *)&start_time_millis);
    bVar5 = ExtractDeps(this,(Result *)err_local,(string *)local_b0,(string *)local_f8,
                        (vector<Node_*,_std::allocator<Node_*>_> *)((long)&deps_type.field_2 + 8),
                        (string *)&start_time_millis);
    if ((!bVar5) && (bVar5 = CommandRunner::Result::success((Result *)err_local), bVar5)) {
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        std::__cxx11::string::append((err_local->field_2)._M_local_buf);
      }
      std::__cxx11::string::append((string *)(err_local->field_2)._M_local_buf);
      *(undefined4 *)&err_local->_M_string_length = 1;
    }
    std::__cxx11::string::~string((string *)&start_time_millis);
  }
  local_158._M_node =
       (_Base_ptr)
       std::
       map<const_Edge_*,_int,_std::less<const_Edge_*>,_std::allocator<std::pair<const_Edge_*const,_int>_>_>
       ::find(&this->running_edges_,
              (key_type *)
              &deps_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  ppVar9 = std::_Rb_tree_iterator<std::pair<const_Edge_*const,_int>_>::operator->(&local_158);
  iVar6 = ppVar9->second;
  iVar10 = GetTimeMillis();
  it._M_node = (_Base_ptr)(iVar10 - this->start_time_millis_);
  local_160 = local_158._M_node;
  local_168 = (_Base_ptr)
              std::
              map<Edge_const*,int,std::less<Edge_const*>,std::allocator<std::pair<Edge_const*const,int>>>
              ::erase_abi_cxx11_((map<Edge_const*,int,std::less<Edge_const*>,std::allocator<std::pair<Edge_const*const,int>>>
                                  *)&this->running_edges_,local_158._M_node);
  ppNVar4 = deps_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  iVar3._M_node = it._M_node;
  pSVar1 = this->status_;
  bVar5 = CommandRunner::Result::success((Result *)err_local);
  (*pSVar1->_vptr_Status[2])(pSVar1,ppNVar4,iVar3._M_node,(ulong)bVar5,&err_local->field_2);
  bVar5 = CommandRunner::Result::success((Result *)err_local);
  ppNVar4 = deps_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  if (!bVar5) {
    this_local._7_1_ =
         Plan::EdgeFinished(&this->plan_,
                            (Edge *)deps_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,kEdgeFailed,
                            local_28);
    output_mtime._4_4_ = 1;
    goto LAB_00113008;
  }
  ppNStack_178 = (Node **)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a0,"restat",(allocator<char> *)((long)&o._M_current + 7));
  bVar5 = Edge::GetBindingBool((Edge *)ppNVar4,(string *)local_1a0);
  std::__cxx11::string::~string((string *)local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&o._M_current + 7));
  local_179 = bVar5;
  if (((byte)this->config_[4] & 1) == 0) {
    o._M_current._6_1_ = 0;
    local_1b0._M_current =
         (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin
                            ((vector<Node_*,_std::allocator<Node_*>_> *)
                             (deps_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage + 5));
    while( true ) {
      new_mtime = (TimeStamp)
                  std::vector<Node_*,_std::allocator<Node_*>_>::end
                            ((vector<Node_*,_std::allocator<Node_*>_> *)
                             (deps_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage + 5));
      bVar5 = __gnu_cxx::operator!=
                        (&local_1b0,
                         (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                          *)&new_mtime);
      if (!bVar5) break;
      pDVar2 = this->disk_interface_;
      ppNVar13 = __gnu_cxx::
                 __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                 operator*(&local_1b0);
      psVar18 = Node::path_abi_cxx11_(*ppNVar13);
      ppNVar11 = (Node **)(**(code **)(*(long *)pDVar2 + 0x18))(pDVar2,psVar18,local_28);
      if (ppNVar11 == (Node **)0xffffffffffffffff) {
        this_local._7_1_ = 0;
        output_mtime._4_4_ = 1;
        goto LAB_00113008;
      }
      if ((long)ppNStack_178 < (long)ppNVar11) {
        ppNStack_178 = ppNVar11;
      }
      ppNVar13 = __gnu_cxx::
                 __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                 operator*(&local_1b0);
      ppNVar12 = (Node **)Node::mtime(*ppNVar13);
      if ((ppNVar12 == ppNVar11) && ((local_179 & 1) != 0)) {
        ppNVar13 = __gnu_cxx::
                   __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                   operator*(&local_1b0);
        bVar5 = Plan::CleanNode(&this->plan_,&this->scan_,*ppNVar13,local_28);
        if (!bVar5) {
          this_local._7_1_ = 0;
          output_mtime._4_4_ = 1;
          goto LAB_00113008;
        }
        o._M_current._6_1_ = 1;
      }
      __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
      operator++(&local_1b0);
    }
    if ((o._M_current._6_1_ & 1) != 0) {
      i._M_current = (Node **)0x0;
      local_1d0._M_current =
           (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin
                              ((vector<Node_*,_std::allocator<Node_*>_> *)
                               (deps_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 2));
      while( true ) {
        input_mtime = (TimeStamp)
                      std::vector<Node_*,_std::allocator<Node_*>_>::end
                                ((vector<Node_*,_std::allocator<Node_*>_> *)
                                 (deps_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 2));
        local_1d8 = __gnu_cxx::
                    __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                    operator-((__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                               *)&input_mtime,
                              (long)*(int *)(deps_nodes.
                                             super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                             _M_impl.super__Vector_impl_data._M_end_of_storage +
                                            0x10));
        bVar5 = __gnu_cxx::operator!=(&local_1d0,&local_1d8);
        if (!bVar5) break;
        pDVar2 = this->disk_interface_;
        ppNVar13 = __gnu_cxx::
                   __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                   operator*(&local_1d0);
        psVar18 = Node::path_abi_cxx11_(*ppNVar13);
        depfile.field_2._8_8_ = (**(code **)(*(long *)pDVar2 + 0x18))(pDVar2,psVar18,local_28);
        if ((Node **)depfile.field_2._8_8_ == (Node **)0xffffffffffffffff) {
          this_local._7_1_ = 0;
          output_mtime._4_4_ = 1;
          goto LAB_00113008;
        }
        if ((long)i._M_current < (long)depfile.field_2._8_8_) {
          i._M_current = (Node **)depfile.field_2._8_8_;
        }
        __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
        operator++(&local_1d0);
      }
      Edge::GetUnescapedDepfile_abi_cxx11_
                ((string *)&depfile_mtime,
                 (Edge *)deps_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
      if (((i._M_current == (Node **)0x0) ||
          (uVar8 = std::__cxx11::string::empty(), (uVar8 & 1) == 0)) ||
         (uVar8 = std::__cxx11::string::empty(), (uVar8 & 1) != 0)) {
LAB_00112adc:
        pSVar1 = this->status_;
        uVar7 = Plan::command_edge_count(&this->plan_);
        (**pSVar1->_vptr_Status)(pSVar1,(ulong)uVar7);
        ppNStack_178 = i._M_current;
        output_mtime._4_4_ = 0;
      }
      else {
        rspfile.field_2._8_8_ =
             (**(code **)(*(long *)this->disk_interface_ + 0x18))
                       (this->disk_interface_,&depfile_mtime,local_28);
        if ((Node **)rspfile.field_2._8_8_ != (Node **)0xffffffffffffffff) {
          if ((long)i._M_current < (long)rspfile.field_2._8_8_) {
            i._M_current = (Node **)rspfile.field_2._8_8_;
          }
          goto LAB_00112adc;
        }
        this_local._7_1_ = 0;
        output_mtime._4_4_ = 1;
      }
      std::__cxx11::string::~string((string *)&depfile_mtime);
      if (output_mtime._4_4_ != 0) goto LAB_00113008;
    }
  }
  bVar5 = Plan::EdgeFinished(&this->plan_,
                             (Edge *)deps_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage,
                             kEdgeSucceeded,local_28);
  if (!bVar5) {
    this_local._7_1_ = 0;
    output_mtime._4_4_ = 1;
    goto LAB_00113008;
  }
  Edge::GetUnescapedRspfile_abi_cxx11_
            ((string *)local_230,
             (Edge *)deps_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  uVar8 = std::__cxx11::string::empty();
  if (((uVar8 & 1) == 0) && ((g_keep_rsp & 1U) == 0)) {
    (**(code **)(*(long *)this->disk_interface_ + 0x30))(this->disk_interface_,local_230);
  }
  pBVar14 = DependencyScan::build_log(&this->scan_);
  if (pBVar14 == (BuildLog *)0x0) {
LAB_00112d4d:
    uVar8 = std::__cxx11::string::empty();
    if (((uVar8 & 1) == 0) && (((byte)this->config_[4] & 1) == 0)) {
      bVar5 = std::vector<Node_*,_std::allocator<Node_*>_>::empty
                        ((vector<Node_*,_std::allocator<Node_*>_> *)
                         (deps_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 5));
      if (bVar5) {
        __assert_fail("!edge->outputs_.empty() && \"should have been rejected by parser\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build.cc"
                      ,899,"bool Builder::FinishCommand(CommandRunner::Result *, string *)");
      }
      local_288._M_current =
           (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin
                              ((vector<Node_*,_std::allocator<Node_*>_> *)
                               (deps_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 5));
      __gnu_cxx::__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>>::
      __normal_iterator<Node**>
                ((__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>> *)
                 &local_280,&local_288);
      while( true ) {
        deps_mtime = (TimeStamp)
                     std::vector<Node_*,_std::allocator<Node_*>_>::end
                               ((vector<Node_*,_std::allocator<Node_*>_> *)
                                (deps_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 5));
        bVar5 = __gnu_cxx::operator!=
                          (&local_280,
                           (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                            *)&deps_mtime);
        if (!bVar5) break;
        pDVar2 = this->disk_interface_;
        ppNVar17 = __gnu_cxx::
                   __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                   operator*(&local_280);
        psVar18 = Node::path_abi_cxx11_(*ppNVar17);
        local_298 = (**(code **)(*(long *)pDVar2 + 0x18))(pDVar2,psVar18,local_28);
        if (local_298 == -1) {
          this_local._7_1_ = 0;
          goto LAB_00112fec;
        }
        this_01 = DependencyScan::deps_log(&this->scan_);
        ppNVar17 = __gnu_cxx::
                   __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                   operator*(&local_280);
        bVar5 = DepsLog::RecordDeps(this_01,*ppNVar17,local_298,
                                    (vector<Node_*,_std::allocator<Node_*>_> *)
                                    ((long)&deps_type.field_2 + 8));
        if (!bVar5) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2d8,"Error writing to deps log: ",&local_2d9);
          piVar15 = __errno_location();
          pcVar16 = strerror(*piVar15);
          std::operator+(&local_2b8,&local_2d8,pcVar16);
          std::__cxx11::string::operator=((string *)local_28,(string *)&local_2b8);
          std::__cxx11::string::~string((string *)&local_2b8);
          std::__cxx11::string::~string((string *)&local_2d8);
          std::allocator<char>::~allocator(&local_2d9);
          this_local._7_1_ = 0;
          goto LAB_00112fec;
        }
        __gnu_cxx::__normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
        operator++(&local_280);
      }
    }
    this_local._7_1_ = 1;
  }
  else {
    pBVar14 = DependencyScan::build_log(&this->scan_);
    bVar5 = BuildLog::RecordCommand
                      (pBVar14,(Edge *)deps_nodes.
                                       super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage,iVar6,
                       (int)it._M_node,(TimeStamp)ppNStack_178);
    if (bVar5) goto LAB_00112d4d;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,"Error writing to build log: ",
               (allocator<char> *)((long)&o_1._M_current + 7));
    piVar15 = __errno_location();
    pcVar16 = strerror(*piVar15);
    std::operator+(&local_250,&local_270,pcVar16);
    std::__cxx11::string::operator=((string *)local_28,(string *)&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator((allocator<char> *)((long)&o_1._M_current + 7));
    this_local._7_1_ = 0;
  }
LAB_00112fec:
  output_mtime._4_4_ = 1;
  std::__cxx11::string::~string((string *)local_230);
LAB_00113008:
  std::__cxx11::string::~string((string *)local_f8);
  std::__cxx11::string::~string((string *)local_b0);
  std::vector<Node_*,_std::allocator<Node_*>_>::~vector
            ((vector<Node_*,_std::allocator<Node_*>_> *)((long)&deps_type.field_2 + 8));
  ScopedMetric::~ScopedMetric((ScopedMetric *)&edge);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Builder::FinishCommand(CommandRunner::Result* result, string* err) {
  METRIC_RECORD("FinishCommand");

  Edge* edge = result->edge;

  // First try to extract dependencies from the result, if any.
  // This must happen first as it filters the command output (we want
  // to filter /showIncludes output, even on compile failure) and
  // extraction itself can fail, which makes the command fail from a
  // build perspective.
  vector<Node*> deps_nodes;
  string deps_type = edge->GetBinding("deps");
  const string deps_prefix = edge->GetBinding("msvc_deps_prefix");
  if (!deps_type.empty()) {
    string extract_err;
    if (!ExtractDeps(result, deps_type, deps_prefix, &deps_nodes,
                     &extract_err) &&
        result->success()) {
      if (!result->output.empty())
        result->output.append("\n");
      result->output.append(extract_err);
      result->status = ExitFailure;
    }
  }

  int64_t start_time_millis, end_time_millis;
  RunningEdgeMap::iterator it = running_edges_.find(edge);
  start_time_millis = it->second;
  end_time_millis = GetTimeMillis() - start_time_millis_;
  running_edges_.erase(it);

  status_->BuildEdgeFinished(edge, end_time_millis, result->success(),
                             result->output);

  // The rest of this function only applies to successful commands.
  if (!result->success()) {
    return plan_.EdgeFinished(edge, Plan::kEdgeFailed, err);
  }

  // Restat the edge outputs
  TimeStamp output_mtime = 0;
  bool restat = edge->GetBindingBool("restat");
  if (!config_.dry_run) {
    bool node_cleaned = false;

    for (vector<Node*>::iterator o = edge->outputs_.begin();
         o != edge->outputs_.end(); ++o) {
      TimeStamp new_mtime = disk_interface_->Stat((*o)->path(), err);
      if (new_mtime == -1)
        return false;
      if (new_mtime > output_mtime)
        output_mtime = new_mtime;
      if ((*o)->mtime() == new_mtime && restat) {
        // The rule command did not change the output.  Propagate the clean
        // state through the build graph.
        // Note that this also applies to nonexistent outputs (mtime == 0).
        if (!plan_.CleanNode(&scan_, *o, err))
          return false;
        node_cleaned = true;
      }
    }

    if (node_cleaned) {
      TimeStamp restat_mtime = 0;
      // If any output was cleaned, find the most recent mtime of any
      // (existing) non-order-only input or the depfile.
      for (vector<Node*>::iterator i = edge->inputs_.begin();
           i != edge->inputs_.end() - edge->order_only_deps_; ++i) {
        TimeStamp input_mtime = disk_interface_->Stat((*i)->path(), err);
        if (input_mtime == -1)
          return false;
        if (input_mtime > restat_mtime)
          restat_mtime = input_mtime;
      }

      string depfile = edge->GetUnescapedDepfile();
      if (restat_mtime != 0 && deps_type.empty() && !depfile.empty()) {
        TimeStamp depfile_mtime = disk_interface_->Stat(depfile, err);
        if (depfile_mtime == -1)
          return false;
        if (depfile_mtime > restat_mtime)
          restat_mtime = depfile_mtime;
      }

      // The total number of edges in the plan may have changed as a result
      // of a restat.
      status_->PlanHasTotalEdges(plan_.command_edge_count());

      output_mtime = restat_mtime;
    }
  }

  if (!plan_.EdgeFinished(edge, Plan::kEdgeSucceeded, err))
    return false;

  // Delete any left over response file.
  string rspfile = edge->GetUnescapedRspfile();
  if (!rspfile.empty() && !g_keep_rsp)
    disk_interface_->RemoveFile(rspfile);

  if (scan_.build_log()) {
    if (!scan_.build_log()->RecordCommand(edge, start_time_millis,
                                          end_time_millis, output_mtime)) {
      *err = string("Error writing to build log: ") + strerror(errno);
      return false;
    }
  }

  if (!deps_type.empty() && !config_.dry_run) {
    assert(!edge->outputs_.empty() && "should have been rejected by parser");
    for (std::vector<Node*>::const_iterator o = edge->outputs_.begin();
         o != edge->outputs_.end(); ++o) {
      TimeStamp deps_mtime = disk_interface_->Stat((*o)->path(), err);
      if (deps_mtime == -1)
        return false;
      if (!scan_.deps_log()->RecordDeps(*o, deps_mtime, deps_nodes)) {
        *err = std::string("Error writing to deps log: ") + strerror(errno);
        return false;
      }
    }
  }
  return true;
}